

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_SVM_2eproto::TableStruct::InitDefaultsImpl(void)

{
  Kernel *pKVar1;
  SupportVectorRegressor *pSVar2;
  Coefficients *pCVar3;
  SupportVectorClassifier *pSVar4;
  
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O0/mlmodel/format/SVM.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  protobuf_DataStructures_2eproto::InitDefaults();
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LinearKernel>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::LinearKernel> *)
                   _LinearKernel_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::RBFKernel>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::RBFKernel> *)
                   _RBFKernel_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::PolyKernel>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::PolyKernel> *)
                   _PolyKernel_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SigmoidKernel>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::SigmoidKernel> *)
                   _SigmoidKernel_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Kernel>::DefaultConstruct
            ((ExplicitlyConstructed<CoreML::Specification::Kernel> *)_Kernel_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SparseNode>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::SparseNode> *)
                   _SparseNode_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SparseVector>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::SparseVector> *)
                   _SparseVector_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SparseSupportVectors>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::SparseSupportVectors> *)
                   _SparseSupportVectors_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::DenseVector>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::DenseVector> *)
                   _DenseVector_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::DenseSupportVectors>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::DenseSupportVectors> *)
                   _DenseSupportVectors_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Coefficients>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::Coefficients> *)
                   _Coefficients_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SupportVectorRegressor>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::SupportVectorRegressor> *)
                   _SupportVectorRegressor_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SupportVectorClassifier>
  ::DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::SupportVectorClassifier> *)
                     _SupportVectorClassifier_default_instance_);
  pKVar1 = Kernel::internal_default_instance();
  pSVar2 = google::protobuf::internal::
           ExplicitlyConstructed<CoreML::Specification::SupportVectorRegressor>::get_mutable
                     ((ExplicitlyConstructed<CoreML::Specification::SupportVectorRegressor> *)
                      _SupportVectorRegressor_default_instance_);
  pSVar2->kernel_ = pKVar1;
  pCVar3 = Coefficients::internal_default_instance();
  pSVar2 = google::protobuf::internal::
           ExplicitlyConstructed<CoreML::Specification::SupportVectorRegressor>::get_mutable
                     ((ExplicitlyConstructed<CoreML::Specification::SupportVectorRegressor> *)
                      _SupportVectorRegressor_default_instance_);
  pSVar2->coefficients_ = pCVar3;
  pKVar1 = Kernel::internal_default_instance();
  pSVar4 = google::protobuf::internal::
           ExplicitlyConstructed<CoreML::Specification::SupportVectorClassifier>::get_mutable
                     ((ExplicitlyConstructed<CoreML::Specification::SupportVectorClassifier> *)
                      _SupportVectorClassifier_default_instance_);
  pSVar4->kernel_ = pKVar1;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::protobuf_DataStructures_2eproto::InitDefaults();
  _LinearKernel_default_instance_.DefaultConstruct();
  _RBFKernel_default_instance_.DefaultConstruct();
  _PolyKernel_default_instance_.DefaultConstruct();
  _SigmoidKernel_default_instance_.DefaultConstruct();
  _Kernel_default_instance_.DefaultConstruct();
  _SparseNode_default_instance_.DefaultConstruct();
  _SparseVector_default_instance_.DefaultConstruct();
  _SparseSupportVectors_default_instance_.DefaultConstruct();
  _DenseVector_default_instance_.DefaultConstruct();
  _DenseSupportVectors_default_instance_.DefaultConstruct();
  _Coefficients_default_instance_.DefaultConstruct();
  _SupportVectorRegressor_default_instance_.DefaultConstruct();
  _SupportVectorClassifier_default_instance_.DefaultConstruct();
  _SupportVectorRegressor_default_instance_.get_mutable()->kernel_ = const_cast< ::CoreML::Specification::Kernel*>(
      ::CoreML::Specification::Kernel::internal_default_instance());
  _SupportVectorRegressor_default_instance_.get_mutable()->coefficients_ = const_cast< ::CoreML::Specification::Coefficients*>(
      ::CoreML::Specification::Coefficients::internal_default_instance());
  _SupportVectorClassifier_default_instance_.get_mutable()->kernel_ = const_cast< ::CoreML::Specification::Kernel*>(
      ::CoreML::Specification::Kernel::internal_default_instance());
}